

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_global_encodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  ushort uVar1;
  int iVar2;
  JSValueUnion JVar3;
  void *pvVar4;
  uint c;
  uint uVar5;
  char *fmt;
  int iVar6;
  long lVar7;
  int iVar8;
  JSValue JVar9;
  StringBuffer local_50;
  
  JVar9 = JS_ToString(ctx,*argv);
  JVar3 = JVar9.u;
  if ((int)JVar9.tag == 6) {
    return JVar9;
  }
  string_buffer_init(ctx,&local_50,*(uint *)((long)JVar3.ptr + 4) & 0x7fffffff);
  iVar8 = 0;
  do {
    while( true ) {
      uVar5 = (uint)*(undefined8 *)((long)JVar3.ptr + 4);
      if ((int)(uVar5 & 0x7fffffff) <= iVar8) {
        JS_FreeValue(ctx,JVar9);
        JVar9 = string_buffer_end(&local_50);
        return JVar9;
      }
      lVar7 = (long)iVar8;
      iVar6 = iVar8 + 1;
      if ((int)uVar5 < 0) break;
      c = (uint)*(byte *)((long)JVar3.ptr + lVar7 + 0x10);
LAB_0015704e:
      if ((((9 < c - 0x30) && (0x19 < (c & 0xffffffdf) - 0x41)) &&
          (pvVar4 = memchr("-_.!~*\'()",c,9), pvVar4 == (void *)0x0)) &&
         ((isComponent != 0 || (iVar2 = isURIReserved(c), iVar2 == 0)))) goto LAB_0015709a;
      string_buffer_putc16(&local_50,c);
      iVar8 = iVar6;
    }
    uVar1 = *(ushort *)((long)JVar3.ptr + lVar7 * 2 + 0x10);
    c = (uint)uVar1;
    if (uVar1 < 0x100) goto LAB_0015704e;
LAB_0015709a:
    if ((short)(c & 0xfc00) == -0x2800) {
      if (iVar6 < (int)(uVar5 & 0x7fffffff)) {
        if ((int)uVar5 < 0) {
          uVar5 = (uint)*(ushort *)((long)JVar3.ptr + lVar7 * 2 + 0x12);
        }
        else {
          uVar5 = (uint)*(byte *)((long)JVar3.ptr + lVar7 + 0x11);
        }
        if (0xfffffbff < uVar5 - 0xe000) {
          iVar6 = iVar8 + 2;
          c = (c & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000;
          encodeURI_hex(&local_50,c >> 0x12 | 0xf0);
          uVar5 = c >> 0xc & 0x3f | 0x80;
LAB_0015716d:
          encodeURI_hex(&local_50,uVar5);
          uVar5 = c >> 6 & 0x3f | 0x80;
          goto LAB_00157183;
        }
      }
      fmt = "expecting surrogate pair";
LAB_001571db:
      js_throw_URIError(ctx,fmt);
      JS_FreeValue(ctx,JVar9);
      (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    if ((c & 0xfc00) == 0xdc00) {
      fmt = "invalid character";
      goto LAB_001571db;
    }
    iVar8 = iVar6;
    if (0x7f < c) {
      if (0x7ff < c) {
        uVar5 = c >> 0xc | 0xe0;
        goto LAB_0015716d;
      }
      uVar5 = c >> 6 | 0xc0;
LAB_00157183:
      encodeURI_hex(&local_50,uVar5);
      c = c & 0x3f | 0x80;
      iVar8 = iVar6;
    }
    encodeURI_hex(&local_50,c);
  } while( true );
}

Assistant:

static JSValue js_global_encodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv,
                                   int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        k++;
        if (isURIUnescaped(c, isComponent)) {
            string_buffer_putc16(b, c);
        } else {
            if (c >= 0xdc00 && c <= 0xdfff) {
                js_throw_URIError(ctx, "invalid character");
                goto fail;
            } else if (c >= 0xd800 && c <= 0xdbff) {
                if (k >= p->len) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c1 = string_get(p, k);
                k++;
                if (c1 < 0xdc00 || c1 > 0xdfff) {
                    js_throw_URIError(ctx, "expecting surrogate pair");
                    goto fail;
                }
                c = (((c & 0x3ff) << 10) | (c1 & 0x3ff)) + 0x10000;
            }
            if (c < 0x80) {
                encodeURI_hex(b, c);
            } else {
                /* XXX: use C UTF-8 conversion ? */
                if (c < 0x800) {
                    encodeURI_hex(b, (c >> 6) | 0xc0);
                } else {
                    if (c < 0x10000) {
                        encodeURI_hex(b, (c >> 12) | 0xe0);
                    } else {
                        encodeURI_hex(b, (c >> 18) | 0xf0);
                        encodeURI_hex(b, ((c >> 12) & 0x3f) | 0x80);
                    }
                    encodeURI_hex(b, ((c >> 6) & 0x3f) | 0x80);
                }
                encodeURI_hex(b, (c & 0x3f) | 0x80);
            }
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}